

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all-to-all.hpp
# Opt level: O3

void __thiscall
diy::detail::
AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>::
operator()(AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
           *this,Block *b,ReduceProxy *srp,RegularSwapPartners *param_3)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  Proxy *pPVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  int iVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
  *pAVar13;
  unsigned_long __n2;
  long lVar14;
  size_t __n;
  int iVar15;
  uint uVar16;
  AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
  *pAVar17;
  long lVar18;
  size_t s;
  pair<int,_int> range;
  pair<int,_int> from_to;
  int gid_in;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes_out;
  key_type local_1a0;
  undefined8 local_198;
  Block<float> *local_190;
  AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
  *local_188;
  AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
  *local_180;
  ReduceProxy *local_178;
  key_type local_170;
  int local_164;
  AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
  *local_160;
  _Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
  local_158;
  int local_124;
  long local_120;
  ReduceProxy local_118;
  
  pAVar13 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
             *)((ulong)((long)(srp->in_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(srp->in_link_).neighbors_.
                             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
  pAVar17 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
             *)((ulong)((long)(srp->out_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(srp->out_link_).neighbors_.
                             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
  uVar16 = (uint)pAVar17;
  if (uVar16 == 0 && (int)pAVar13 == 0) {
    ReduceProxy::ReduceProxy
              (&local_118,&srp->super_Proxy,srp->block_,0,srp->assigner_,&this->empty_link,
               &this->all_neighbors_link);
    SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()(this->op,b,&local_118)
    ;
    local_158._M_impl._0_4_ =
         (local_118.out_link_.neighbors_.
          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
          super__Vector_impl_data._M_start)->gid;
    pmVar8 = std::
             map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
             ::operator[]((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                           *)((long)&local_118 + 0x18),(key_type *)&local_158);
    local_158._M_impl._0_8_ =
         *local_118.out_link_.neighbors_.
          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
          super__Vector_impl_data._M_start;
    pmVar12 = std::
              map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
              ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                            *)((long)&local_118 + 0x48U),(key_type *)&local_158);
    MemoryBuffer::swap(pmVar8,pmVar12);
    pmVar8->position = 0;
    std::
    _Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
    ::clear((_Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             *)((long)&local_118 + 0x48U));
    pBVar6 = local_118.in_link_.neighbors_.
             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pBVar5 = local_118.in_link_.neighbors_.
             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar4 = local_118.in_link_.neighbors_.
             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_118.round_ = 1;
    local_118.in_link_.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_118.out_link_.neighbors_.
         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_118.in_link_.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_118.out_link_.neighbors_.
         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_118.in_link_.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_118.out_link_.neighbors_.
         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_118.out_link_.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
    _M_impl.super__Vector_impl_data._M_start = pBVar4;
    local_118.out_link_.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
    _M_impl.super__Vector_impl_data._M_finish = pBVar5;
    local_118.out_link_.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pBVar6;
    SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()(this->op,b,&local_118)
    ;
  }
  else {
    local_178 = srp;
    if ((int)pAVar13 == 0) {
      ReduceProxy::ReduceProxy
                (&local_118,&srp->super_Proxy,srp->block_,0,srp->assigner_,&this->empty_link,
                 &this->all_neighbors_link);
      SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
                (this->op,b,&local_118);
      p_Var1 = &local_158._M_impl.super__Rb_tree_header;
      local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      if (local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)0x0) {
        local_158._M_impl.super__Rb_tree_header._M_header._M_color =
             local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        local_158._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_158._M_impl.super__Rb_tree_header._M_header._M_left =
             local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_158._M_impl.super__Rb_tree_header._M_header._M_right =
             local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
        _M_parent = &p_Var1->_M_header;
        local_158._M_impl.super__Rb_tree_header._M_node_count =
             local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)((long)&local_118 + 0x50U);
        local_118.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)((long)&local_118 + 0x50U);
      }
      uVar9 = (ulong)((long)local_118.out_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_118.out_link_.neighbors_.
                           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      local_164 = (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                       (long)(int)uVar16);
      if (0 < (int)uVar16) {
        local_190 = (Block<float> *)&(srp->super_Proxy).outgoing_;
        local_120 = (long)local_164;
        local_160 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)(ulong)(uVar16 & 0x7fffffff);
        local_180 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)((ulong)local_180 & 0xffffffff00000000);
        pAVar17 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                   *)0x0;
        do {
          lVar18 = (long)pAVar17 * local_120;
          local_188 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                       *)((long)&pAVar17->op + 1);
          lVar14 = (long)local_188 * local_120;
          local_198 = CONCAT44((int)lVar14,(int)lVar18);
          local_1a0 = (srp->out_link_).neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pAVar17];
          pmVar12 = std::
                    map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                    ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                                  *)local_190,&local_1a0);
          (*(pmVar12->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar12,&local_198,4);
          (*(pmVar12->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar12,(long)&local_198 + 4,4);
          if (lVar18 < lVar14) {
            lVar14 = (long)(int)local_180;
            iVar15 = local_164;
            do {
              local_1a0 = (srp->out_link_).neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)pAVar17];
              local_170 = (key_type)
                          ((long)local_118.out_link_.neighbors_.
                                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar14] << 0x20 |
                          (ulong)(uint)(srp->super_Proxy).gid_);
              pmVar12 = std::
                        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                                      *)local_190,&local_1a0);
              (*(pmVar12->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar12,&local_170,4);
              (*(pmVar12->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar12,&local_170.proc,4);
              local_1a0 = (srp->out_link_).neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)pAVar17];
              local_170 = local_118.out_link_.neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar14];
              pmVar12 = std::
                        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                                      *)&local_158,&local_170);
              pmVar10 = std::
                        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                                      *)local_190,&local_1a0);
              (*(pmVar10->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar10,&pmVar12->position,8);
              if (pmVar12->position != 0) {
                (*(pmVar10->super_BinaryBuffer)._vptr_BinaryBuffer[2])
                          (pmVar10,(pmVar12->buffer).super__Vector_base<char,_std::allocator<char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar14 = lVar14 + 1;
              iVar15 = iVar15 + -1;
              srp = local_178;
            } while (iVar15 != 0);
          }
          local_180 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                       *)CONCAT44(local_180._4_4_,(int)local_180 + local_164);
          pAVar17 = local_188;
        } while (local_188 != local_160);
      }
      std::
      _Rb_tree<diy::BlockID,_std::pair<const_diy::BlockID,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
      ::~_Rb_tree(&local_158);
    }
    else {
      local_188 = pAVar13;
      if (uVar16 != 0) {
        local_158._M_impl._0_4_ = 8;
        local_158._M_impl._4_4_ = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_118,
                   (long)(int)uVar16,(value_type_conflict5 *)&local_158,(allocator_type *)&local_198
                  );
        local_198 = 0;
        if ((int)(uint)local_188 < 1) {
          iVar15 = 0;
        }
        else {
          local_190 = (Block<float> *)&(srp->super_Proxy).incoming_;
          local_180 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                       *)(ulong)((uint)local_188 & 0x7fffffff);
          pAVar13 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)0x0;
          local_160 = pAVar17;
          do {
            local_158._M_impl._0_4_ =
                 (local_178->in_link_).neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pAVar13].gid;
            pmVar8 = std::
                     map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                     ::operator[]((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                                   *)local_190,(key_type *)&local_158);
            (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,&local_198,4);
            (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,(long)&local_198 + 4,4);
            iVar15 = (local_198._4_4_ - (int)local_198) / (int)local_160;
            local_158._M_impl._0_4_ = 0;
            local_158._M_impl._4_4_ = 0;
            if (pmVar8->position <
                (ulong)((long)(pmVar8->buffer).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar8->buffer).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start)) {
              do {
                (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,&local_158,4);
                (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])
                          (pmVar8,&local_158._M_impl.field_0x4,4);
                (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,&local_1a0,8);
                iVar7 = (local_158._M_impl._4_4_ - (int)local_198) / iVar15;
                *(unsigned_long *)(local_118.super_Proxy._0_8_ + (long)iVar7 * 8) =
                     (long)local_1a0 + 0x10 +
                     *(pointer)(local_118.super_Proxy._0_8_ + (long)iVar7 * 8);
                pcVar2 = (pmVar8->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                uVar9 = pmVar8->position + (long)local_1a0;
                pmVar8->position = uVar9;
              } while (uVar9 < (ulong)((long)pcVar2 -
                                      (long)(pmVar8->buffer).
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data._M_start));
            }
            pmVar8->position = 0;
            pAVar13 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                       *)((long)&pAVar13->op + 1);
          } while (pAVar13 != local_180);
          iVar15 = local_198._4_4_ - (int)local_198;
          pAVar17 = local_160;
        }
        uVar16 = (uint)pAVar17;
        local_190 = (Block<float> *)CONCAT44(local_190._4_4_,iVar15 / (int)uVar16);
        if (0 < (int)uVar16) {
          pPVar3 = &local_178->super_Proxy;
          iVar15 = 0;
          uVar9 = 0;
          do {
            local_158._M_impl._0_8_ =
                 (local_178->out_link_).neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
            pmVar12 = std::
                      map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      ::operator[](&pPVar3->outgoing_,(key_type *)&local_158);
            std::vector<char,_std::allocator<char>_>::reserve
                      (&pmVar12->buffer,*(size_type *)(local_118.super_Proxy._0_8_ + uVar9 * 8));
            local_158._M_impl._4_4_ = (int)local_198 + iVar15 + (int)local_190;
            local_158._M_impl._0_4_ = (int)local_198 + iVar15;
            (*(pmVar12->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar12,(key_type *)&local_158,4)
            ;
            (*(pmVar12->super_BinaryBuffer)._vptr_BinaryBuffer[2])
                      (pmVar12,&local_158._M_impl.field_0x4,4);
            uVar9 = uVar9 + 1;
            iVar15 = iVar15 + (int)local_190;
          } while ((uVar16 & 0x7fffffff) != uVar9);
        }
        if (0 < (int)(uint)local_188) {
          local_160 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                       *)&(local_178->super_Proxy).incoming_;
          pPVar3 = &local_178->super_Proxy;
          local_188 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                       *)(ulong)((uint)local_188 & 0x7fffffff);
          pAVar17 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)0x0;
          do {
            local_158._M_impl._0_4_ =
                 (local_178->in_link_).neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pAVar17].gid;
            local_180 = pAVar17;
            pmVar8 = std::
                     map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                     ::operator[]((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                                   *)local_160,(key_type *)&local_158);
            (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,&local_198,4);
            (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,(long)&local_198 + 4,4);
            local_1a0.gid = 0;
            local_1a0.proc = 0;
            if (pmVar8->position <
                (ulong)((long)(pmVar8->buffer).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar8->buffer).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start)) {
              do {
                (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,&local_1a0,4);
                (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,&local_1a0.proc,4);
                local_158._M_impl._0_8_ =
                     (local_178->out_link_).neighbors_.
                     super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [(local_1a0.proc - (int)local_198) / (int)local_190];
                pmVar12 = std::
                          map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                          ::operator[](&pPVar3->outgoing_,(key_type *)&local_158);
                (*(pmVar12->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar12,&local_1a0,4);
                (*(pmVar12->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar12,&local_1a0.proc,4);
                (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])
                          (pmVar8,(key_type *)&local_158,8);
                pmVar8->position = pmVar8->position - 8;
                __n = local_158._M_impl._0_8_ + 8;
                std::vector<char,_std::allocator<char>_>::resize
                          (&pmVar12->buffer,pmVar12->position + __n);
                if (__n != 0) {
                  memmove((pmVar12->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + pmVar12->position,
                          (pmVar8->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + pmVar8->position,__n);
                }
                pmVar12->position = pmVar12->position + __n;
                uVar9 = __n + pmVar8->position;
                pmVar8->position = uVar9;
              } while (uVar9 < (ulong)((long)(pmVar8->buffer).
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .super__Vector_impl_data._M_finish -
                                      (long)(pmVar8->buffer).
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data._M_start));
            }
            pAVar17 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                       *)((long)&local_180->op + 1);
          } while (pAVar17 != local_188);
        }
        if ((pointer)local_118.super_Proxy._0_8_ == (pointer)0x0) {
          return;
        }
        operator_delete((void *)local_118.super_Proxy._0_8_,
                        (long)local_118.super_Proxy.iexchange_ - local_118.super_Proxy._0_8_);
        return;
      }
      local_190 = b;
      local_180 = this;
      ReduceProxy::ReduceProxy
                (&local_118,&srp->super_Proxy,srp->block_,1,srp->assigner_,&this->all_neighbors_link
                 ,&this->empty_link);
      p_Var1 = &local_158._M_impl.super__Rb_tree_header;
      local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      if (local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)0x0) {
        local_158._M_impl.super__Rb_tree_header._M_header._M_color =
             local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        local_158._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_158._M_impl.super__Rb_tree_header._M_header._M_left =
             local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_158._M_impl.super__Rb_tree_header._M_header._M_right =
             local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
        _M_parent = &p_Var1->_M_header;
        local_158._M_impl.super__Rb_tree_header._M_node_count =
             local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)((long)&local_118 + 0x20U);
        local_118.super_Proxy.incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)((long)&local_118 + 0x20U);
      }
      local_198 = 0;
      if (0 < (int)(uint)local_188) {
        local_188 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)(ulong)((uint)local_188 & 0x7fffffff);
        pAVar17 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                   *)0x0;
        do {
          local_124 = (local_178->in_link_).neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pAVar17].gid;
          pmVar8 = std::
                   map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                   ::operator[]((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                                 *)&local_158,&local_124);
          (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,&local_198,4);
          (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,(long)&local_198 + 4,4);
          while (pmVar8->position <
                 (ulong)((long)(pmVar8->buffer).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pmVar8->buffer).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start)) {
            local_1a0.gid = 0;
            local_1a0.proc = 0;
            (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,&local_1a0,4);
            (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar8,&local_1a0.proc,4);
            local_170.gid = local_1a0.gid;
            pmVar11 = std::
                      map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                      ::operator[]((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                                    *)((long)&local_118 + 0x18U),&local_170.gid);
            Serialization<diy::MemoryBuffer>::load(&pmVar8->super_BinaryBuffer,pmVar11);
            local_170.gid = local_1a0.gid;
            pmVar11 = std::
                      map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                      ::operator[]((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                                    *)((long)&local_118 + 0x18U),&local_170.gid);
            pmVar11->position = 0;
          }
          pAVar17 = (AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
                     *)((long)&pAVar17->op + 1);
        } while (pAVar17 != local_188);
      }
      SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger::operator()
                (local_180->op,local_190,&local_118);
      std::
      _Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_diy::MemoryBuffer>,_std::_Select1st<std::pair<const_int,_diy::MemoryBuffer>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                   *)&local_158);
    }
  }
  local_118.out_link_.super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__0014e530;
  if (local_118.out_link_.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.out_link_.neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.out_link_.neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.out_link_.neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_118.in_link_.super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__0014e530;
  if (local_118.in_link_.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.in_link_.neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.in_link_.neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.in_link_.neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Master::Proxy::~Proxy(&local_118.super_Proxy);
  return;
}

Assistant:

void operator()(Block* b, const ReduceProxy& srp, const RegularSwapPartners&) const
    {
      int k_in  = srp.in_link().size();
      int k_out = srp.out_link().size();

      if (k_in == 0 && k_out == 0)  // special case of a single block
      {
          ReduceProxy all_srp(std::move(const_cast<ReduceProxy&>(srp)), srp.block(), 0, srp.assigner(), empty_link, all_neighbors_link);

          op(b, all_srp);

          MemoryBuffer& in_queue = all_srp.incoming(all_srp.out_link().target(0).gid);
          in_queue.swap(all_srp.outgoing(all_srp.out_link().target(0)));
          in_queue.reset();
          all_srp.outgoing()->clear();

          // change to incoming proxy
          all_srp.set_round(1);
          auto& in_link  = const_cast<Link&>(all_srp.in_link());
          auto& out_link = const_cast<Link&>(all_srp.out_link());
          in_link.swap(out_link);

          op(b, all_srp);
          return;
      }

      if (k_in == 0)                // initial round
      {
        ReduceProxy all_srp(std::move(const_cast<ReduceProxy&>(srp)), srp.block(), 0, srp.assigner(), empty_link, all_neighbors_link);
        op(b, all_srp);

        Master::Proxy::OutgoingQueues all_queues;
        all_queues.swap(*all_srp.outgoing());       // clears out the queues and stores them locally

        // enqueue outgoing
        int group = all_srp.out_link().size() / k_out;
        for (int i = 0; i < k_out; ++i)
        {
          std::pair<int,int> range(i*group, (i+1)*group);
          srp.enqueue(srp.out_link().target(i), range);
          for (int j = i*group; j < (i+1)*group; ++j)
          {
            int from = srp.gid();
            int to   = all_srp.out_link().target(j).gid;
            srp.enqueue(srp.out_link().target(i), std::make_pair(from, to));
            srp.enqueue(srp.out_link().target(i), all_queues[all_srp.out_link().target(j)]);
          }
        }
      } else if (k_out == 0)        // final round
      {
        // dequeue incoming + reorder into the correct order
        ReduceProxy all_srp(std::move(const_cast<ReduceProxy&>(srp)), srp.block(), 1, srp.assigner(), all_neighbors_link, empty_link);

        Master::Proxy::IncomingQueues all_incoming;
        all_incoming.swap(*all_srp.incoming());

        std::pair<int, int> range;      // all the ranges should be the same
        for (int i = 0; i < k_in; ++i)
        {
          int gid_in = srp.in_link().target(i).gid;
          MemoryBuffer& in = all_incoming[gid_in];
          load(in, range);
          while(in)
          {
            std::pair<int, int> from_to;
            load(in, from_to);
            load(in, all_srp.incoming(from_to.first));
            all_srp.incoming(from_to.first).reset();
          }
        }

        op(b, all_srp);
      } else                                        // intermediate round: reshuffle queues
      {
        // add up buffer sizes
        std::vector<size_t> sizes_out(k_out, sizeof(std::pair<int,int>));
        std::pair<int, int> range;      // all the ranges should be the same
        for (int i = 0; i < k_in; ++i)
        {
          MemoryBuffer& in = srp.incoming(srp.in_link().target(i).gid);

          load(in, range);
          int group = (range.second - range.first)/k_out;

          std::pair<int, int> from_to;
          size_t s;
          while(in)
          {
            diy::load(in, from_to);
            diy::load(in, s);

            int j = (from_to.second - range.first) / group;
            sizes_out[j] += s + sizeof(size_t) + sizeof(std::pair<int,int>);
            in.skip(s);
          }
          in.reset();
        }

        // reserve outgoing buffers of correct size
        int group = (range.second - range.first)/k_out;
        for (int i = 0; i < k_out; ++i)
        {
          MemoryBuffer& out = srp.outgoing(srp.out_link().target(i));
          out.reserve(sizes_out[i]);

          std::pair<int, int> out_range;
          out_range.first  = range.first + group*i;
          out_range.second = range.first + group*(i+1);
          save(out, out_range);
        }

        // re-direct the queues
        for (int i = 0; i < k_in; ++i)
        {
          MemoryBuffer& in = srp.incoming(srp.in_link().target(i).gid);

          load(in, range);

          std::pair<int, int> from_to;
          while(in)
          {
            load(in, from_to);
            int j = (from_to.second - range.first) / group;

            MemoryBuffer& out = srp.outgoing(srp.out_link().target(j));
            save(out, from_to);
            MemoryBuffer::copy(in, out);
          }
        }
      }
    }